

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

bool __thiscall pbrt::BVHAggregate::IntersectP(BVHAggregate *this,Ray *ray,Float tMax)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  LinearBVHNode *pLVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int nodesToVisit [64];
  undefined8 local_158;
  uint local_150;
  Tuple3<pbrt::Vector3,_float> local_148;
  int iStack_13c;
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_138 [66];
  
  pLVar5 = this->nodes;
  iVar7 = 0;
  if (pLVar5 != (LinearBVHNode *)0x0) {
    auVar10._8_4_ = 0x3f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._12_4_ = 0x3f800000;
    uVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar11._4_4_ = uVar2;
    auVar11._0_4_ = uVar1;
    auVar11._8_8_ = 0;
    local_148.z = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10 = vdivps_avx(auVar10,auVar11);
    local_148._0_8_ = vmovlps_avx(auVar10);
    auVar10 = vcmpps_avx(auVar10,ZEXT816(0) << 0x20,1);
    auVar3._8_4_ = 1;
    auVar3._0_8_ = 0x100000001;
    auVar3._12_4_ = 1;
    auVar10 = vandps_avx512vl(auVar10,auVar3);
    local_158 = vmovlps_avx(auVar10);
    iVar8 = 0;
    local_150 = (uint)(local_148.z < 0.0);
    uVar6 = 0;
    do {
      uVar6 = uVar6 + 1;
      pLVar5 = pLVar5 + iVar8;
      bVar4 = Bounds3<float>::IntersectP
                        (&pLVar5->bounds,&ray->o,&ray->d,tMax,(Vector3f *)&local_148,
                         (int *)&local_158);
      if (bVar4) {
        if (pLVar5->nPrimitives == 0) {
          if (*(int *)((long)&local_158 + (ulong)pLVar5->axis * 4) == 0) {
            iVar8 = iVar8 + 1;
            aaStack_138[iVar7] = pLVar5->field_1;
            iVar7 = iVar7 + 1;
          }
          else {
            aaStack_138[iVar7].primitivesOffset = iVar8 + 1;
            iVar8 = (pLVar5->field_1).primitivesOffset;
            iVar7 = iVar7 + 1;
          }
        }
        else {
          lVar9 = 0;
          while ((uint)lVar9 < (uint)pLVar5->nPrimitives) {
            bVar4 = PrimitiveHandle::IntersectP
                              ((this->primitives).
                               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                               (pLVar5->field_1).primitivesOffset + lVar9,ray,tMax);
            lVar9 = lVar9 + 1;
            if (bVar4) {
              iVar7 = 1;
              goto LAB_003d98e9;
            }
          }
          if (iVar7 == 0) goto LAB_003d990c;
          iVar8 = aaStack_138[(long)iVar7 + -1].primitivesOffset;
          iVar7 = iVar7 + -1;
        }
      }
      else {
        if (iVar7 == 0) {
          iVar7 = 0;
          goto LAB_003d98e9;
        }
        iVar8 = aaStack_138[(long)iVar7 + -1].primitivesOffset;
        iVar7 = iVar7 + -1;
      }
      pLVar5 = this->nodes;
    } while( true );
  }
LAB_003d98f4:
  return SUB41(iVar7,0);
LAB_003d990c:
  iVar7 = 0;
LAB_003d98e9:
  *(long *)(in_FS_OFFSET + -0x350) = *(long *)(in_FS_OFFSET + -0x350) + (ulong)uVar6;
  goto LAB_003d98f4;
}

Assistant:

bool BVHAggregate::IntersectP(const Ray &ray, Float tMax) const {
    if (nodes == nullptr)
        return false;
    Vector3f invDir(1.f / ray.d.x, 1.f / ray.d.y, 1.f / ray.d.z);
    int dirIsNeg[3] = {static_cast<int>(invDir.x < 0), static_cast<int>(invDir.y < 0),
                       static_cast<int>(invDir.z < 0)};
    int nodesToVisit[64];
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesVisited = 0;

    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            // Process BVH node _node_ for traversal
            if (node->nPrimitives > 0) {
                for (int i = 0; i < node->nPrimitives; ++i) {
                    if (primitives[node->primitivesOffset + i].IntersectP(ray, tMax)) {
                        bvhNodesVisited += nodesVisited;
                        return true;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];
            } else {
                if (dirIsNeg[node->axis] != 0) {
                    /// second child first
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }
    bvhNodesVisited += nodesVisited;
    return false;
}